

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O1

void __thiscall mir::inst::Variable::display(Variable *this,ostream *o)

{
  SharedTyPtr SVar1;
  Displayable local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  (**(((this->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     super_Displayable)._vptr_Displayable)();
  if (this->is_memory_var == true) {
    std::__ostream_insert<char,std::char_traits<char>>(o," memory (",9);
    SVar1 = type((Variable *)&local_28);
    (**(code **)*local_28._vptr_Displayable)
              (local_28._vptr_Displayable,o,
               SVar1.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi._M_pi);
    std::__ostream_insert<char,std::char_traits<char>>(o,")",1);
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
  }
  if (this->is_temp_var == true) {
    std::__ostream_insert<char,std::char_traits<char>>(o," temp",5);
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,", priority: ",0xc);
  std::ostream::operator<<(o,this->priority);
  return;
}

Assistant:

void Variable::display(std::ostream& o) const {
  o << *ty;
  if (is_memory_var) {
    o << " memory (" << *(type()) << ")";
  }
  if (is_temp_var) {
    o << " temp";
  }
  o << ", priority: " << priority;
}